

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O0

void format::load_mtx_csc_real(string *filename,CSC **A)

{
  read_file_error *this;
  byte bVar1;
  allocator local_3e1;
  string local_3e0;
  string local_3c0 [5];
  mtx_format_error *e;
  mtx_arith_error *e_1;
  mtx_header_error *e_2;
  ifstream local_220 [8];
  ifstream fin;
  CSC **A_local;
  string *filename_local;
  
  std::ifstream::ifstream(local_220,(string *)filename,_S_in);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::ifstream::close();
    this = (read_file_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)local_3c0,(string *)filename);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3e0,"Failed to read file",&local_3e1);
    read_file_error::read_file_error(this,local_3c0,&local_3e0);
    __cxa_throw(this,&read_file_error::typeinfo,read_file_error::~read_file_error);
  }
  read_mtx_csc_real(local_220,A,false);
  std::ifstream::close();
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

void load_mtx_csc_real(std::string &filename, CSC *&A) {
  std::ifstream fin(filename);
  if(fin.is_open()){
   try {
    read_mtx_csc_real(fin, A);
   } catch (const mtx_format_error& e) {
    throw mtx_format_error(e.expected_format(),
                           e.got_format(),
                           filename,
                           e.what());
   } catch (const mtx_arith_error& e) {
    throw mtx_arith_error(e.expected_arith(),
                          e.got_arith(),
                          filename,
                          e.what());
   } catch (const mtx_header_error& e) {
    throw mtx_header_error(filename, e.what());
   }
  } else {
   fin.close();
   throw read_file_error(filename);
  }
  fin.close();
 }